

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O1

void __thiscall GMESong::GMESong(GMESong *this,Music_Emu *emu,int sample_rate)

{
  int iVar1;
  SDL_mutex *pSVar2;
  undefined4 extraout_var;
  
  MusInfo::MusInfo((MusInfo *)this);
  (this->super_StreamSong).m_Stream = (SoundStream *)0x0;
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__GMESong_006f4318;
  pSVar2 = (SDL_mutex *)SDL_CreateMutex();
  (this->CritSec).CritSec = pSVar2;
  if (pSVar2 == (SDL_mutex *)0x0) {
    I_FatalError("Failed to create a critical section mutex.");
  }
  this->Emu = emu;
  this->SampleRate = sample_rate;
  this->CurrTrack = 0;
  this->TrackInfo = (gme_info_t *)0x0;
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xb])(GSnd,Read,0x8000,0,(ulong)(uint)sample_rate,this);
  (this->super_StreamSong).m_Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

GMESong::GMESong(Music_Emu *emu, int sample_rate)
{
	Emu = emu;
	SampleRate = sample_rate;
	CurrTrack = 0;
	TrackInfo = NULL;
	m_Stream = GSnd->CreateStream(Read, 32*1024, 0, sample_rate, this);
}